

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

LoopHeader * __thiscall
Js::InterpreterStackFrame::DoLoopBodyStart
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,
          bool doProfileLoopCheck,bool isFirstIteration)

{
  undefined1 *puVar1;
  byte *pbVar2;
  undefined2 uVar3;
  FunctionBody *this_00;
  NativeCodeGenerator *pNVar4;
  long lVar5;
  code *pcVar6;
  undefined4 uVar7;
  bool bVar8;
  State SVar9;
  bool bVar10;
  InterpreterStackFrame IVar11;
  uint32 uVar12;
  int iVar13;
  RegSlot RVar14;
  RegSlot RVar15;
  RegSlot RVar16;
  RegSlot RVar17;
  RegSlot RVar18;
  uint uVar19;
  OpLayoutType OVar20;
  uint uVar21;
  uint uVar22;
  undefined4 *puVar23;
  LoopHeader *this_01;
  LoopEntryPointInfo *this_02;
  undefined4 extraout_var;
  Var pvVar24;
  void *pvVar25;
  InterpreterStackFrame *pIVar26;
  uint32 uVar27;
  undefined1 local_70 [8];
  AutoRestoreLoopNumbers autoRestore;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  autoRestore._12_4_ = layoutSize;
  uVar12 = FunctionBody::GetCountField(this_00,LoopCount);
  if (uVar12 <= loopNumber) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar23 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x17a3,"(loopNumber < fn->GetLoopCount())",
                                "loopNumber < fn->GetLoopCount()");
    if (!bVar8) goto LAB_00a480bd;
    *puVar23 = 0;
  }
  if (((byte)this[0xd4] & 6) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar23 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x17a4,"(!this->IsInCatchOrFinallyBlock())",
                                "!this->IsInCatchOrFinallyBlock()");
    if (!bVar8) goto LAB_00a480bd;
    *puVar23 = 0;
  }
  this_01 = FunctionBody::GetLoopHeader(this_00,loopNumber);
  uVar3 = *(undefined2 *)(this + 0xd4);
  this_01->isInTry = (Type)((byte)uVar3 & 1);
  this_01->isInTryFinally = (Type)((byte)((ushort)uVar3 >> 8) & 1);
  this_02 = LoopHeader::GetCurrentEntryPointInfo(this_01);
  bVar8 = FunctionProxy::IsJitLoopBodyPhaseForced((FunctionProxy *)this_00);
  if ((((bVar8) && (((this_00->super_ParseableFunctionInfo).flags & Flags_HasTry) == Flags_None)) &&
      (this_01->interpretCount == 0)) &&
     ((this_02 != (LoopEntryPointInfo *)0x0 && (this_01->hasYield == false)))) {
    SVar9 = EntryPointInfo::GetState(&this_02->super_EntryPointInfo);
    if (SVar9 == NotScheduled) {
      bVar8 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
      lVar5 = *(long *)(this + 0x78);
      if (bVar8) {
        pbVar2 = (byte *)(*(long *)(lVar5 + 0x3b8) + 0x1570);
        *pbVar2 = *pbVar2 | *(byte *)(*(long *)(this + 0xc0) + (ulong)loopNumber);
      }
      pNVar4 = *(NativeCodeGenerator **)(lVar5 + 0x12a0);
      RVar14 = FunctionBody::GetLocalsCount(this_00);
      GenerateLoopBody(pNVar4,this_00,this_01,&this_02->super_EntryPointInfo,RVar14,
                       (Var *)(this + 0x160));
    }
LAB_00a47a0a:
    SVar9 = EntryPointInfo::GetState(&this_02->super_EntryPointInfo);
    if (SVar9 == CodeGenDone) {
      bVar8 = Phases::IsEnabled((Phases *)&DAT_015b6718,JITLoopBodyPhase);
      if ((bVar8) && (DAT_015bc46a == '\x01')) {
        FunctionBody::DumpFunctionId(this_00,true);
        iVar13 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])(this_00);
        Output::Print(L": %-20s LoopBody Execute  Loop: %2d\n",CONCAT44(extraout_var,iVar13),
                      (ulong)loopNumber);
        Output::Flush();
      }
      this_01->nativeCount = this_01->nativeCount + 1;
      this_02->used = true;
      EntryPointInfo::EnsureIsReadyToCall(&this_02->super_EntryPointInfo);
      puVar1 = &(this_02->super_EntryPointInfo).field_0x18;
      *puVar1 = *puVar1 | 0x10;
      RVar14 = FunctionBody::GetEnvRegister(*(FunctionBody **)(this + 0x88));
      if (RVar14 != 0xffffffff) {
        *(undefined8 *)(this + (ulong)RVar14 * 8 + 0x160) =
             *(undefined8 *)(*(long *)(this + 0x80) + 0x30);
      }
      RVar15 = FunctionBody::GetLocalClosureRegister(*(FunctionBody **)(this + 0x88));
      RVar16 = FunctionBody::GetLocalFrameDisplayRegister(*(FunctionBody **)(this + 0x88));
      RVar17 = FunctionBody::GetParamClosureRegister(*(FunctionBody **)(this + 0x88));
      if (((this_02->super_EntryPointInfo).field_0x18 & 4) == 0) {
        if (RVar15 != 0xffffffff) {
          *(undefined8 *)(this + (ulong)RVar15 * 8 + 0x160) = *(undefined8 *)(this + 0x58);
        }
        if (RVar16 != 0xffffffff) {
          *(undefined8 *)(this + (ulong)RVar16 * 8 + 0x160) = *(undefined8 *)(this + 0x50);
        }
        if (RVar17 != 0xffffffff) {
          pIVar26 = *(InterpreterStackFrame **)(this + 0x60);
LAB_00a47d99:
          *(InterpreterStackFrame **)(this + (ulong)RVar17 * 8 + 0x160) = pIVar26;
        }
      }
      else {
        if (RVar15 != 0xffffffff) {
          *(InterpreterStackFrame **)(this + (ulong)RVar15 * 8 + 0x160) = this + 0x58;
        }
        if (RVar16 != 0xffffffff) {
          *(InterpreterStackFrame **)(this + (ulong)RVar16 * 8 + 0x160) = this + 0x50;
        }
        if (RVar17 != 0xffffffff) {
          pIVar26 = this + 0x60;
          goto LAB_00a47d99;
        }
      }
      uVar12 = FunctionBody::GetCountField(*(FunctionBody **)(this + 0x88),InnerScopeCount);
      if (uVar12 != 0) {
        uVar27 = 0;
        do {
          RVar18 = FunctionBody::GetFirstInnerScopeRegister(*(FunctionBody **)(this + 0x88));
          pvVar24 = InnerScopeFromIndex(this,uVar27);
          *(Var *)(this + (ulong)(RVar18 + uVar27) * 8 + 0x160) = pvVar24;
          uVar27 = uVar27 + 1;
        } while (uVar12 != uVar27);
      }
      if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0) {
        DoLoopBodyStart(unsigned_int,Js::LayoutSize,bool,bool)::AutoRestoreLoopNumbers::
        AutoRestoreLoopNumbers(Js::InterpreterStackFrame__unsigned_int_bool_
                  (local_70,this,loopNumber,doProfileLoopCheck);
        pvVar25 = (*(this_02->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod)
                            (*(RecyclableObject **)(this + 0x80),
                             (CallInfo)*(RecyclableObject **)(this + 0x80),0x80000001,0,0,0,0,
                             0x80000001,this);
        uVar19 = ::Math::PointerCastToIntegral<unsigned_int>(pvVar25);
      }
      else {
        DoLoopBodyStart(unsigned_int,Js::LayoutSize,bool,bool)::AutoRestoreLoopNumbers::
        AutoRestoreLoopNumbers(Js::InterpreterStackFrame__unsigned_int_bool_
                  (local_70,this,loopNumber,doProfileLoopCheck);
        pvVar25 = (*(this_02->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod)
                            (*(RecyclableObject **)(this + 0x80),
                             (CallInfo)*(RecyclableObject **)(this + 0x80),0x80000001,0,0,0,0,
                             0x80000001,this);
        uVar19 = ::Math::PointerCastToIntegral<unsigned_int>(pvVar25);
      }
      DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
                ((AutoRestoreLoopNumbers *)local_70);
      if (RVar14 != 0xffffffff) {
        *(undefined8 *)(this + (ulong)RVar14 * 8 + 0x160) = 0;
      }
      if (RVar15 != 0xffffffff) {
        *(undefined8 *)(this + (ulong)RVar15 * 8 + 0x160) = 0;
      }
      if (RVar16 != 0xffffffff) {
        *(undefined8 *)(this + (ulong)RVar16 * 8 + 0x160) = 0;
      }
      if (RVar17 != 0xffffffff) {
        *(undefined8 *)(this + (ulong)RVar17 * 8 + 0x160) = 0;
      }
      if (uVar12 != 0) {
        uVar27 = 0;
        do {
          RVar14 = FunctionBody::GetFirstInnerScopeRegister(*(FunctionBody **)(this + 0x88));
          SetInnerScopeFromIndex(this,uVar27,*(Var *)(this + (ulong)(RVar14 + uVar27) * 8 + 0x160));
          *(undefined8 *)(this + (ulong)(RVar14 + uVar27) * 8 + 0x160) = 0;
          uVar27 = uVar27 + 1;
        } while (uVar12 != uVar27);
      }
      OVar20 = OpCodeUtil::GetOpCodeLayout(ProfiledLoopBodyStart);
      uVar7 = autoRestore._12_4_;
      if (OVar20._value != 0x4d) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar23 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1833,
                                    "(Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1)"
                                    ,
                                    "Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1"
                                   );
        if (!bVar8) goto LAB_00a480bd;
        *puVar23 = 0;
      }
      OVar20 = OpCodeUtil::GetOpCodeLayout(LoopBodyStart);
      if (OVar20._value == 0x4d) {
LAB_00a4801e:
        if (uVar19 != this_01->startOffset) {
          iVar13 = -2;
          if (uVar7 != 0) {
            iVar13 = ((uVar7 == 1) - 6) + (uint)(uVar7 == 1);
          }
          uVar21 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
          if (uVar19 != uVar21 + iVar13) {
            CheckIfLoopIsHot(this,this_01->profiledLoopCounter);
            if (this_01->endOffset <= uVar19) {
              uVar22 = ((DAT_015b0950 + 1U & 0xff) - 1) * (uint)DAT_015b0954;
              if (this_02->totalJittedLoopIterations <= uVar22) {
                uVar22 = this_02->totalJittedLoopIterations;
              }
              this_02->totalJittedLoopIterations = uVar22 & 0xff;
              this_02->jittedLoopIterationsSinceLastBailout = 0;
            }
            ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,uVar19);
            return this_01;
          }
        }
        this_01->interpretCount = this_01->interpretCount + 1;
        return this_01;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar23 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1834,
                                  "(Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1)"
                                  ,
                                  "Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1"
                                 );
      if (bVar8) {
        *puVar23 = 0;
        goto LAB_00a4801e;
      }
      goto LAB_00a480bd;
    }
    bVar8 = false;
  }
  else {
    if (this_02 != (LoopEntryPointInfo *)0x0) goto LAB_00a47a0a;
    bVar8 = true;
  }
  this_01->interpretCount = this_01->interpretCount + (uint)!isFirstIteration;
  uVar21 = FunctionBody::GetLoopInterpretCount(*(FunctionBody **)(this + 0x88),this_01);
  uVar19 = this_01->interpretCount;
  if (uVar21 < uVar19) {
    if ((((*(char *)(*(long *)(this + 0x78) + 0x1250) == '\0') &&
         (bVar10 = FunctionBody::DoJITLoopBody(this_00), bVar10)) &&
        (!bVar8 && this_01->hasYield == false)) &&
       (SVar9 = EntryPointInfo::GetState(&this_02->super_EntryPointInfo), SVar9 == NotScheduled)) {
      pNVar4 = *(NativeCodeGenerator **)(*(long *)(this + 0x78) + 0x12a0);
      RVar14 = FunctionBody::GetLocalsCount(this_00);
      GenerateLoopBody(pNVar4,this_00,this_01,&this_02->super_EntryPointInfo,RVar14,
                       (Var *)(this + 0x160));
    }
  }
  else {
    if (!doProfileLoopCheck) {
      return (LoopHeader *)0x0;
    }
    if (((byte)this[0xd6] & 0x10) == 0) {
      return (LoopHeader *)0x0;
    }
    uVar21 = FunctionBody::GetLoopProfileThreshold(this_00,uVar21);
    if (uVar19 <= uVar21) {
      return (LoopHeader *)0x0;
    }
    IVar11 = this[0xd6];
    if (((byte)IVar11 & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar23 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1890,"(!switchProfileMode)","!switchProfileMode");
      if (!bVar8) goto LAB_00a480bd;
      *puVar23 = 0;
      IVar11 = this[0xd6];
    }
    this[0xd6] = (InterpreterStackFrame)((byte)IVar11 | 8);
    if (*(int *)(this + 0xd8) != -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar23 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar23 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1892,"(switchProfileModeOnLoopEndNumber == 0u - 1)",
                                  "switchProfileModeOnLoopEndNumber == 0u - 1");
      if (!bVar8) {
LAB_00a480bd:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar23 = 0;
    }
    *(uint32 *)(this + 0xd8) = loopNumber;
  }
  return (LoopHeader *)0x0;
}

Assistant:

LoopHeader const * InterpreterStackFrame::DoLoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, const bool doProfileLoopCheck, const bool isFirstIteration)
    {
#if ENABLE_PROFILE_INFO
        class AutoRestoreLoopNumbers
        {
        private:
            InterpreterStackFrame * const interpreterStackFrame;
            uint32 loopNumber;
            bool doProfileLoopCheck;

        public:
            AutoRestoreLoopNumbers(InterpreterStackFrame *const interpreterStackFrame, uint32 loopNumber, bool doProfileLoopCheck)
                : interpreterStackFrame(interpreterStackFrame), loopNumber(loopNumber), doProfileLoopCheck(doProfileLoopCheck)
            {
                Assert(interpreterStackFrame->currentLoopNum == LoopHeader::NoLoop);
                interpreterStackFrame->currentLoopNum = loopNumber;
                interpreterStackFrame->m_functionBody->SetRecentlyBailedOutOfJittedLoopBody(false);
            }

            ~AutoRestoreLoopNumbers()
            {
                interpreterStackFrame->currentLoopNum = LoopHeader::NoLoop;
                interpreterStackFrame->currentLoopCounter = 0;
                Js::FunctionBody* fn = interpreterStackFrame->m_functionBody;
                if (fn->RecentlyBailedOutOfJittedLoopBody())
                {
                    if (doProfileLoopCheck && interpreterStackFrame->isAutoProfiling)
                    {
                        // Start profiling the loop after a bailout. Some bailouts require subsequent profile data collection such
                        // that the rejitted loop body would not bail out again for the same reason.
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        Assert(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1);
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = loopNumber;
                    }
                }
                else
                {
                    if (interpreterStackFrame->switchProfileModeOnLoopEndNumber == loopNumber)
                    {
                        // Stop profiling since the jitted loop body would be exiting the loop
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = 0u - 1;
                    }

                    interpreterStackFrame->scriptContext->GetThreadContext()->DecrementLoopDepth();
                }
            }
        };
#endif

        Js::FunctionBody* fn = this->m_functionBody;

        Assert(loopNumber < fn->GetLoopCount());
        Assert(!this->IsInCatchOrFinallyBlock());

        Js::LoopHeader *loopHeader = fn->GetLoopHeader(loopNumber);
        loopHeader->isInTry = this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryBlock);
        loopHeader->isInTryFinally = this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryFinallyBlock);

        Js::LoopEntryPointInfo * entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

        if (fn->ForceJITLoopBody() && loopHeader->interpretCount == 0 && loopHeader->hasYield == false &&
            (entryPointInfo != NULL && entryPointInfo->IsNotScheduled()))
        {
#if ENABLE_PROFILE_INFO
            if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))
            {
                scriptContext->GetThreadContext()->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);
            }
#endif

#if ENABLE_NATIVE_CODEGEN
            GenerateLoopBody(scriptContext->GetNativeCodeGenerator(), fn, loopHeader, entryPointInfo, fn->GetLocalsCount(), this->m_localSlots);
#endif
        }

#if ENABLE_NATIVE_CODEGEN
        // If we have JITted the loop, call the JITted code
        if (entryPointInfo != NULL && entryPointInfo->IsCodeGenDone())
        {
#if DBG_DUMP
            if (PHASE_TRACE1(Js::JITLoopBodyPhase) && CONFIG_FLAG(Verbose))
            {
                fn->DumpFunctionId(true);
                Output::Print(_u(": %-20s LoopBody Execute  Loop: %2d\n"), fn->GetDisplayName(), loopNumber);
                Output::Flush();
            }
            loopHeader->nativeCount++;
#endif
#ifdef BGJIT_STATS
            entryPointInfo->MarkAsUsed();
#endif

            entryPointInfo->EnsureIsReadyToCall();
            entryPointInfo->SetNativeEntryPointProcessed();

            RegSlot envReg = this->m_functionBody->GetEnvRegister();
            if (envReg != Constants::NoRegister)
            {
                this->SetNonVarReg(envReg, this->LdEnv());
            }

            RegSlot localClosureReg = this->m_functionBody->GetLocalClosureRegister();
            RegSlot localFrameDisplayReg = this->m_functionBody->GetLocalFrameDisplayRegister();
            RegSlot paramClosureReg = this->m_functionBody->GetParamClosureRegister();

            if (entryPointInfo->HasJittedStackClosure())
            {
                // The jitted code is expecting the closure registers to point to known stack locations where
                // the closures can be found and possibly boxed.
                // In a jitted loop body, those locations are the local closure fields on the interpreter instance.
                if (localClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localClosureReg, &this->localClosure);
                }

                if (localFrameDisplayReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localFrameDisplayReg, &this->localFrameDisplay);
                }

                if (paramClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(paramClosureReg, &this->paramClosure);
                }
            }
            else
            {
                // In non-stack-closure jitted code, the closure registers are expected to hold the addresses
                // of the actual structures.
                if (localClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localClosureReg, this->localClosure);
                }

                if (localFrameDisplayReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localFrameDisplayReg, this->localFrameDisplay);
                }

                if (paramClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(paramClosureReg, this->paramClosure);
                }
            }

            uint32 innerScopeCount = this->m_functionBody->GetInnerScopeCount();
            for (uint32 i = 0; i < innerScopeCount; i++)
            {
                // As with the function-level scope, transfer the inner scopes from the interpreter's side storage
                // to their dedicated register slots.
                SetNonVarReg(this->m_functionBody->GetFirstInnerScopeRegister() + i, InnerScopeFromIndex(i));
            }

            uint newOffset = 0;
            if (fn->GetIsAsmJsFunction())
            {
                AutoRestoreLoopNumbers autoRestore(this, loopNumber, doProfileLoopCheck);
                newOffset = this->CallAsmJsLoopBody(entryPointInfo->jsMethod);
            }
            else
            {
                AutoRestoreLoopNumbers autoRestore(this, loopNumber, doProfileLoopCheck);
                newOffset = this->CallLoopBody(entryPointInfo->jsMethod);
            }

            if (envReg != Constants::NoRegister)
            {
                SetNonVarReg(envReg, nullptr);
            }

            if (localClosureReg != Constants::NoRegister)
            {
                SetNonVarReg(localClosureReg, nullptr);
            }

            if (localFrameDisplayReg != Constants::NoRegister)
            {
                SetNonVarReg(localFrameDisplayReg, nullptr);
            }

            if (paramClosureReg != Constants::NoRegister)
            {
                SetNonVarReg(paramClosureReg, nullptr);
            }

            for (uint32 i = 0; i < innerScopeCount; i++)
            {
                // Get the (possibly updated) scopes from their registers and put them back in side storage.
                // (Getting the updated values may not be necessary, actually, but it can't hurt.)
                // Then null out the registers.
                RegSlot reg = this->m_functionBody->GetFirstInnerScopeRegister() + i;
                SetInnerScopeFromIndex(i, GetNonVarReg(reg));
                SetNonVarReg(reg, nullptr);
            }

            Assert(Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1);
            Assert(Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1);
            Assert(Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize) == Js::OpCodeUtil::EncodedSize(Js::OpCode::ProfiledLoopBodyStart, layoutSize));
            uint byteCodeSize = Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize);
            if (layoutSize == SmallLayout)
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Small);
            }
            else if (layoutSize == MediumLayout)
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Medium);
            }
            else
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Large);
            }

            if (newOffset == loopHeader->startOffset || newOffset == m_reader.GetCurrentOffset() - byteCodeSize)
            {
                // If we bail out back the start of the loop, or start of this LoopBodyStart just skip and interpret the loop
                // instead of trying to start the loop body again

                // Increment the interpret count of the loop
                loopHeader->interpretCount++;
            }
            else
            {
                this->CheckIfLoopIsHot(loopHeader->profiledLoopCounter);

                if (newOffset >= loopHeader->endOffset)
                {
                    // Reset the totalJittedLoopIterations for the next invocation of this loop entry point
                    entryPointInfo->totalJittedLoopIterations =
                        static_cast<uint8>(
                            min(
                                static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejit))) *
                                (Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() - 1),
                                entryPointInfo->totalJittedLoopIterations));
                    entryPointInfo->jittedLoopIterationsSinceLastBailout = 0;
                }
                m_reader.SetCurrentOffset(newOffset);
            }

            return loopHeader;
        }
#endif

        // Increment the interpret count of the loop
        loopHeader->interpretCount += !isFirstIteration;

        const uint loopInterpretCount = GetFunctionBody()->GetLoopInterpretCount(loopHeader);
        if (loopHeader->interpretCount > loopInterpretCount)
        {
            if (this->scriptContext->GetConfig()->IsNoNative())
            {
                return nullptr;
            }

            if (!fn->DoJITLoopBody() || loopHeader->hasYield)
            {
                return nullptr;
            }

#if ENABLE_NATIVE_CODEGEN
#if ENABLE_OOP_NATIVE_CODEGEN
            // If for some reason OOP JIT isn't connected (e.g. it crashed), don't attempt to JIT a loop body
            if (JITManager::GetJITManager()->IsOOPJITEnabled() && !JITManager::GetJITManager()->IsConnected())
            {
                return nullptr;
            }
#endif
            // If the job is not scheduled then we need to schedule it now.
            // It is possible a job was scheduled earlier and we find ourselves looking at the same entry point
            // again. For example, if the function with the loop was JITed and bailed out then as we finish
            // the call in the interpreter we might encounter a loop for which we had scheduled a JIT job before
            // the function was initially scheduled. In such cases, that old JIT job will complete. If it completes
            // successfully then we can go ahead and use it. If it fails then it will eventually revert to the
            // NotScheduled state. Since transitions from NotScheduled can only occur on the main thread,
            // by checking the state we are safe from racing with the JIT thread when looking at the other fields
            // of the entry point.
            if (entryPointInfo != NULL && entryPointInfo->IsNotScheduled())
            {
                GenerateLoopBody(scriptContext->GetNativeCodeGenerator(), fn, loopHeader, entryPointInfo, fn->GetLocalsCount(), this->m_localSlots);
            }
#endif
        }
#if ENABLE_PROFILE_INFO
        else if (
            doProfileLoopCheck &&
            isAutoProfiling &&
            loopHeader->interpretCount > fn->GetLoopProfileThreshold(loopInterpretCount))
        {
            // Start profiling the loop so that the jitted loop body will have some profile data to use
            Assert(!switchProfileMode);
            switchProfileMode = true;
            Assert(switchProfileModeOnLoopEndNumber == 0u - 1);
            switchProfileModeOnLoopEndNumber = loopNumber;
        }
#endif

        return nullptr;
    }